

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fail_function.hpp
# Opt level: O3

bool __thiscall
boost::spirit::qi::detail::
fail_function<__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,boost::spirit::unused_type_const,boost::spirit::unused_type>
::operator()(void *this,
            plus<boost::spirit::qi::action<boost::spirit::qi::any_binary_parser<boost::spirit::qi::detail::integer<8>,_(boost::spirit::endian::endianness)2,_8>,_boost::phoenix::actor<boost::proto::exprns_::basic_expr<boost::phoenix::detail::tag::function_eval,_boost::proto::argsns_::list3<boost::proto::exprns_::basic_expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::phoenix::stl::push_back>,_0L>,_boost::phoenix::actor<boost::proto::exprns_::basic_expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::reference_wrapper<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_0L>_>,_boost::phoenix::actor<boost::spirit::argument<0>_>_>,_3L>_>_>_>
            *component,unused_type *attr)

{
  undefined8 *puVar1;
  pass_container<boost::spirit::qi::detail::fail_function<__gnu_cxx::__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_const_boost::spirit::unused_type,_boost::spirit::unused_type>,_const_boost::spirit::unused_type,_mpl_::bool_<false>_>
  f;
  bool bVar2;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  iter;
  undefined8 local_38;
  undefined8 *local_30;
  undefined8 uStack_28;
  undefined8 uStack_20;
  unused_type *puStack_18;
  unused_type *local_10;
  
  puVar1 = *this;
  puStack_18 = *(unused_type **)((long)this + 0x18);
  local_38 = *puVar1;
  local_30 = &local_38;
  uStack_28 = *(undefined8 *)((long)this + 8);
  uStack_20 = *(undefined8 *)((long)this + 0x10);
  f.f.last = (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
              *)uStack_28;
  f.f.first = (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
               *)local_30;
  f.f.context = (unused_type *)uStack_20;
  f.f.skipper = puStack_18;
  f.attr = attr;
  local_10 = attr;
  bVar2 = plus<boost::spirit::qi::action<boost::spirit::qi::any_binary_parser<boost::spirit::qi::detail::integer<8>,(boost::spirit::endian::endianness)2,8>,boost::phoenix::actor<boost::proto::exprns_::basic_expr<boost::phoenix::detail::tag::function_eval,boost::proto::argsns_::list3<boost::proto::exprns_::basic_expr<boost::proto::tagns_::tag::terminal,boost::proto::argsns_::term<boost::phoenix::stl::push_back>,0l>,boost::phoenix::actor<boost::proto::exprns_::basic_expr<boost::proto::tagns_::tag::terminal,boost::proto::argsns_::term<boost::reference_wrapper<std::vector<unsigned_char,std::allocator<unsigned_char>>>>,0l>>,boost::phoenix::actor<boost::spirit::argument<0>>>,3l>>>>
          ::
          parse_container<boost::spirit::qi::detail::pass_container<boost::spirit::qi::detail::fail_function<__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,boost::spirit::unused_type_const,boost::spirit::unused_type>,boost::spirit::unused_type_const,mpl_::bool_<false>>>
                    ((plus<boost::spirit::qi::action<boost::spirit::qi::any_binary_parser<boost::spirit::qi::detail::integer<8>,(boost::spirit::endian::endianness)2,8>,boost::phoenix::actor<boost::proto::exprns_::basic_expr<boost::phoenix::detail::tag::function_eval,boost::proto::argsns_::list3<boost::proto::exprns_::basic_expr<boost::proto::tagns_::tag::terminal,boost::proto::argsns_::term<boost::phoenix::stl::push_back>,0l>,boost::phoenix::actor<boost::proto::exprns_::basic_expr<boost::proto::tagns_::tag::terminal,boost::proto::argsns_::term<boost::reference_wrapper<std::vector<unsigned_char,std::allocator<unsigned_char>>>>,0l>>,boost::phoenix::actor<boost::spirit::argument<0>>>,3l>>>>
                      *)component,f);
  if (bVar2) {
    *puVar1 = local_38;
  }
  return !bVar2;
}

Assistant:

bool operator()(Component const& component, Attribute& attr) const
        {
            // return true if the parser fails
            return !component.parse(first, last, context, skipper, attr);
        }